

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.c
# Opt level: O0

void lzma_check_init(lzma_check_state *check,lzma_check type)

{
  lzma_check type_local;
  lzma_check_state *check_local;
  
  switch(type) {
  case LZMA_CHECK_NONE:
    break;
  case LZMA_CHECK_CRC32:
    (check->state).crc32 = 0;
    break;
  default:
    break;
  case LZMA_CHECK_CRC64:
    (check->state).crc64 = 0;
    break;
  case LZMA_CHECK_SHA256:
    lzma_sha256_init(check);
  }
  return;
}

Assistant:

extern void
lzma_check_init(lzma_check_state *check, lzma_check type)
{
	switch (type) {
	case LZMA_CHECK_NONE:
		break;

#ifdef HAVE_CHECK_CRC32
	case LZMA_CHECK_CRC32:
		check->state.crc32 = 0;
		break;
#endif

#ifdef HAVE_CHECK_CRC64
	case LZMA_CHECK_CRC64:
		check->state.crc64 = 0;
		break;
#endif

#ifdef HAVE_CHECK_SHA256
	case LZMA_CHECK_SHA256:
		lzma_sha256_init(check);
		break;
#endif

	default:
		break;
	}

	return;
}